

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors.cpp
# Opt level: O3

int __thiscall SensorBase::init(SensorBase *this,EVP_PKEY_CTX *ctx)

{
  path *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Impl *p_Var2;
  pointer pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint uVar6;
  int iVar7;
  long *plVar8;
  mapped_type *pmVar9;
  uint uVar10;
  size_type *psVar11;
  ulong uVar12;
  ulong uVar13;
  uint __uval;
  uint __val;
  uint uVar14;
  float fVar15;
  path offset_path;
  path scale_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  path name_path;
  path local_100;
  path local_d8;
  path *local_b0;
  path local_a8;
  string_type local_80;
  path local_60;
  
  uVar14 = (uint)ctx;
  __val = -uVar14;
  if (0 < (int)uVar14) {
    __val = uVar14;
  }
  uVar14 = 1;
  if (9 < __val) {
    uVar12 = (ulong)__val;
    uVar6 = 4;
    do {
      uVar14 = uVar6;
      uVar10 = (uint)uVar12;
      if (uVar10 < 100) {
        uVar14 = uVar14 - 2;
        goto LAB_0010c68c;
      }
      if (uVar10 < 1000) {
        uVar14 = uVar14 - 1;
        goto LAB_0010c68c;
      }
      if (uVar10 < 10000) goto LAB_0010c68c;
      uVar12 = uVar12 / 10000;
      uVar6 = uVar14 + 4;
    } while (99999 < uVar10);
    uVar14 = uVar14 + 1;
  }
LAB_0010c68c:
  uVar12 = (ulong)ctx >> 0x1f & 1;
  local_100._M_pathname._M_dataplus._M_p = (pointer)&local_100._M_pathname.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_100,(char)uVar14 + (char)uVar12);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_100._M_pathname._M_dataplus._M_p + uVar12,uVar14,__val);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,0x11130d);
  paVar1 = &local_d8._M_pathname.field_2;
  psVar11 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_d8._M_pathname.field_2._M_allocated_capacity = *psVar11;
    local_d8._M_pathname.field_2._8_8_ = plVar8[3];
    local_d8._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_d8._M_pathname.field_2._M_allocated_capacity = *psVar11;
    local_d8._M_pathname._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_d8._M_pathname._M_string_length = plVar8[1];
  *plVar8 = (long)psVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::filesystem::__cxx11::path::path(&local_60,&local_d8._M_pathname,auto_format);
  local_b0 = &this->sysfspath;
  if (&local_60 != local_b0) {
    std::__cxx11::string::operator=((string *)local_b0,(string *)&local_60);
    uVar4 = local_60._32_8_;
    local_60._M_cmpts = (_List)0x0;
    local_60._33_7_ = 0;
    uVar5 = local_60._32_8_;
    p_Var2 = *(_Impl **)&(this->sysfspath)._M_cmpts;
    local_60._M_cmpts = SUB81(uVar4,0);
    local_60._33_7_ = SUB87(uVar4,1);
    (this->sysfspath)._M_cmpts = local_60._M_cmpts;
    *(undefined7 *)&(this->sysfspath).field_0x21 = local_60._33_7_;
    local_60._32_8_ = uVar5;
    if (p_Var2 != (_Impl *)0x0) {
      std::filesystem::__cxx11::path::_List::_Impl_deleter::operator()
                ((_Impl_deleter *)&(this->sysfspath)._M_cmpts,p_Var2);
    }
    std::filesystem::__cxx11::path::clear(&local_60);
  }
  std::filesystem::__cxx11::path::~path(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_pathname._M_dataplus._M_p,
                    local_d8._M_pathname.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_pathname._M_dataplus._M_p != &local_100._M_pathname.field_2) {
    operator_delete(local_100._M_pathname._M_dataplus._M_p,
                    local_100._M_pathname.field_2._M_allocated_capacity + 1);
  }
  uVar14 = 1;
  if (9 < __val) {
    uVar13 = (ulong)__val;
    uVar6 = 4;
    do {
      uVar14 = uVar6;
      uVar10 = (uint)uVar13;
      if (uVar10 < 100) {
        uVar14 = uVar14 - 2;
        goto LAB_0010c82f;
      }
      if (uVar10 < 1000) {
        uVar14 = uVar14 - 1;
        goto LAB_0010c82f;
      }
      if (uVar10 < 10000) goto LAB_0010c82f;
      uVar13 = uVar13 / 10000;
      uVar6 = uVar14 + 4;
    } while (99999 < uVar10);
    uVar14 = uVar14 + 1;
  }
LAB_0010c82f:
  local_100._M_pathname._M_dataplus._M_p = (pointer)&local_100._M_pathname.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_100,(char)uVar12 + (char)uVar14);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_100._M_pathname._M_dataplus._M_p + uVar12,uVar14,__val);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,0x11132d);
  psVar11 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_d8._M_pathname.field_2._M_allocated_capacity = *psVar11;
    local_d8._M_pathname.field_2._8_8_ = plVar8[3];
    local_d8._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_d8._M_pathname.field_2._M_allocated_capacity = *psVar11;
    local_d8._M_pathname._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_d8._M_pathname._M_string_length = plVar8[1];
  *plVar8 = (long)psVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::filesystem::__cxx11::path::path(&local_60,&local_d8._M_pathname,auto_format);
  this_00 = &this->devbufpath;
  if (&local_60 != this_00) {
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_60);
    uVar4 = local_60._32_8_;
    local_60._M_cmpts = (_List)0x0;
    local_60._33_7_ = 0;
    uVar5 = local_60._32_8_;
    p_Var2 = *(_Impl **)&(this->devbufpath)._M_cmpts;
    local_60._M_cmpts = SUB81(uVar4,0);
    local_60._33_7_ = SUB87(uVar4,1);
    (this->devbufpath)._M_cmpts = local_60._M_cmpts;
    *(undefined7 *)&(this->devbufpath).field_0x21 = local_60._33_7_;
    local_60._32_8_ = uVar5;
    if (p_Var2 != (_Impl *)0x0) {
      std::filesystem::__cxx11::path::_List::_Impl_deleter::operator()
                ((_Impl_deleter *)&(this->devbufpath)._M_cmpts,p_Var2);
    }
    std::filesystem::__cxx11::path::clear(&local_60);
  }
  std::filesystem::__cxx11::path::~path(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_pathname._M_dataplus._M_p,
                    local_d8._M_pathname.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_pathname._M_dataplus._M_p != &local_100._M_pathname.field_2) {
    operator_delete(local_100._M_pathname._M_dataplus._M_p,
                    local_100._M_pathname.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_assign((string *)&this->sensor_basename);
  std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
            (&local_d8,(char (*) [5])"name",auto_format);
  std::filesystem::__cxx11::operator/(&local_60,local_b0,&local_d8);
  std::filesystem::__cxx11::path::~path(&local_d8);
  readstr_abi_cxx11_(&local_d8._M_pathname,local_60._M_pathname._M_dataplus._M_p,0x100);
  std::__cxx11::string::operator=((string *)&this->type,(string *)&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_pathname._M_dataplus._M_p,
                    local_d8._M_pathname.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_a8._M_pathname.field_2;
  pcVar3 = (this->sensor_basename)._M_dataplus._M_p;
  local_a8._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar3,pcVar3 + (this->sensor_basename)._M_string_length);
  std::__cxx11::string::append((char *)&local_a8);
  std::filesystem::__cxx11::path::path(&local_100,&local_a8._M_pathname,auto_format);
  std::filesystem::__cxx11::operator/(&local_d8,local_b0,&local_100);
  std::filesystem::__cxx11::path::~path(&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_pathname._M_dataplus._M_p,
                    local_a8._M_pathname.field_2._M_allocated_capacity + 1);
  }
  fVar15 = readfloat(local_d8._M_pathname._M_dataplus._M_p);
  local_a8._M_pathname._M_dataplus._M_p._0_4_ = fVar15;
  local_100._M_pathname._M_dataplus._M_p = (pointer)&local_100._M_pathname.field_2;
  pcVar3 = (this->sensor_basename)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_100,pcVar3,pcVar3 + (this->sensor_basename)._M_string_length);
  std::__cxx11::string::append((char *)&local_100);
  pmVar9 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->dict,&local_100._M_pathname);
  std::any::operator=(pmVar9,(float *)&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_pathname._M_dataplus._M_p != &local_100._M_pathname.field_2) {
    operator_delete(local_100._M_pathname._M_dataplus._M_p,
                    local_100._M_pathname.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = (this->sensor_basename)._M_dataplus._M_p;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar3,pcVar3 + (this->sensor_basename)._M_string_length);
  std::__cxx11::string::append((char *)&local_80);
  std::filesystem::__cxx11::path::path(&local_a8,&local_80,auto_format);
  std::filesystem::__cxx11::operator/(&local_100,local_b0,&local_a8);
  std::filesystem::__cxx11::path::~path(&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  fVar15 = readfloat(local_100._M_pathname._M_dataplus._M_p);
  local_80._M_dataplus._M_p._0_4_ = fVar15;
  pcVar3 = (this->sensor_basename)._M_dataplus._M_p;
  local_a8._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar3,pcVar3 + (this->sensor_basename)._M_string_length);
  std::__cxx11::string::append((char *)&local_a8);
  pmVar9 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->dict,&local_a8._M_pathname);
  std::any::operator=(pmVar9,(float *)&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_pathname._M_dataplus._M_p,
                    local_a8._M_pathname.field_2._M_allocated_capacity + 1);
  }
  reset(this);
  pipe(this->qpipe);
  std::
  vector<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scan_t>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scan_t>_>_>
  ::_M_erase_at_end(&this->enabled_scan_elem,
                    (this->enabled_scan_elem).
                    super__Vector_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scan_t>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scan_t>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  (**this->_vptr_SensorBase)(this);
  (*this->_vptr_SensorBase[1])(this);
  enable_buffer(this);
  iVar7 = open((this_00->_M_pathname)._M_dataplus._M_p,0);
  this->devfd = iVar7;
  if (iVar7 == -1) {
    init((EVP_PKEY_CTX *)this_00);
  }
  std::filesystem::__cxx11::path::~path(&local_100);
  std::filesystem::__cxx11::path::~path(&local_d8);
  std::filesystem::__cxx11::path::~path(&local_60);
  return (int)CONCAT71((int7)((ulong)this >> 8),iVar7 == -1);
}

Assistant:

bool SensorBase::init(int id,std::string _sensor_basename)
{
	sysfspath=IIODEV_SYSFS_PATH_BASE+std::to_string(id);
	devbufpath=DEV_PATH+std::to_string(id);
	sensor_basename=_sensor_basename;

	using filesystem::path;
	path name_path=sysfspath/"name";
	type=readstr(name_path.c_str());
	path scale_path=sysfspath/(sensor_basename+"_scale");
	dict[sensor_basename+"_scale"]=readfloat(scale_path.c_str());
	path offset_path=sysfspath/(sensor_basename+"_offset");
	dict[sensor_basename+"_offset"]=readfloat(offset_path.c_str());

	reset();
	ignore_result(pipe(qpipe));
	enabled_scan_elem.clear();
	enable_scan_elements();
	update_values();
	enable_buffer();
	devfd=open(devbufpath.c_str(),O_RDONLY);
	if(!~devfd)
		return LOG('E',"failed to open the iio buffer device: %s",devbufpath.c_str()),1;
	return 0;
}